

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O1

uint duckdb_lz4::LZ4_count(BYTE *pIn,BYTE *pMatch,BYTE *pInLimit)

{
  ulong uVar1;
  ulong uVar2;
  ulong in_RAX;
  int iVar3;
  
  iVar3 = (int)pIn;
  if (pIn < pInLimit + -7) {
    uVar1 = *(ulong *)pMatch;
    uVar2 = *(ulong *)pIn;
    if (uVar1 == uVar2) {
      pIn = pIn + 8;
      pMatch = pMatch + 8;
    }
    else {
      in_RAX = (((uVar2 ^ uVar1) + 0x1ffffffffffffff ^ uVar2 ^ uVar1) & 0x101010101010100) *
               0x101010101010101 >> 0x38;
    }
    if (uVar1 != uVar2) {
      return (uint)in_RAX;
    }
  }
  do {
    if (pInLimit + -7 <= pIn) {
      if ((pIn < pInLimit + -3) && ((int)*(ulong *)pMatch == (int)*(ulong *)pIn)) {
        pIn = (BYTE *)((long)pIn + 4);
        pMatch = (BYTE *)((long)pMatch + 4);
      }
      if ((pIn < pInLimit + -1) && ((short)*(ulong *)pMatch == (short)*(ulong *)pIn)) {
        pIn = (BYTE *)((long)pIn + 2);
        pMatch = (BYTE *)((long)pMatch + 2);
      }
      if (pIn < pInLimit) {
        pIn = (BYTE *)((long)pIn + (ulong)((char)*(ulong *)pMatch == (char)*(ulong *)pIn));
      }
      return (int)pIn - iVar3;
    }
    uVar1 = *(ulong *)pMatch;
    uVar2 = *(ulong *)pIn;
    if (uVar1 == uVar2) {
      pIn = (BYTE *)((long)pIn + 8);
      pMatch = (BYTE *)((long)pMatch + 8);
    }
    else {
      pIn = (BYTE *)((long)pIn +
                    ((((uVar2 ^ uVar1) + 0x1ffffffffffffff ^ uVar2 ^ uVar1) & 0x101010101010100) *
                     0x101010101010101 >> 0x38));
      in_RAX = (ulong)(uint)((int)pIn - iVar3);
    }
  } while (uVar1 == uVar2);
  return (uint)in_RAX;
}

Assistant:

LZ4_FORCE_INLINE
unsigned LZ4_count(const BYTE* pIn, const BYTE* pMatch, const BYTE* pInLimit)
{
    const BYTE* const pStart = pIn;

    if (likely(pIn < pInLimit-(STEPSIZE-1))) {
        reg_t const diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) {
            pIn+=STEPSIZE; pMatch+=STEPSIZE;
        } else {
            return LZ4_NbCommonBytes(diff);
    }   }

    while (likely(pIn < pInLimit-(STEPSIZE-1))) {
        reg_t const diff = LZ4_read_ARCH(pMatch) ^ LZ4_read_ARCH(pIn);
        if (!diff) { pIn+=STEPSIZE; pMatch+=STEPSIZE; continue; }
        pIn += LZ4_NbCommonBytes(diff);
        return (unsigned)(pIn - pStart);
    }

    if ((STEPSIZE==8) && (pIn<(pInLimit-3)) && (LZ4_read32(pMatch) == LZ4_read32(pIn))) { pIn+=4; pMatch+=4; }
    if ((pIn<(pInLimit-1)) && (LZ4_read16(pMatch) == LZ4_read16(pIn))) { pIn+=2; pMatch+=2; }
    if ((pIn<pInLimit) && (*pMatch == *pIn)) pIn++;
    return (unsigned)(pIn - pStart);
}